

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall smf::MidiFile::getFileDurationInTicks(MidiFile *this)

{
  bool bVar1;
  int iVar2;
  MidiEventList *pMVar3;
  MidiEvent *pMVar4;
  int local_28;
  int local_24;
  int i;
  int output;
  MidiFile *mf;
  bool revertToDelta;
  MidiFile *this_local;
  
  bVar1 = isDeltaTicks(this);
  if (bVar1) {
    makeAbsoluteTicks(this);
  }
  local_24 = 0;
  for (local_28 = 0; iVar2 = getTrackCount(this), local_28 < iVar2; local_28 = local_28 + 1) {
    pMVar3 = operator[](this,local_28);
    pMVar4 = MidiEventList::back(pMVar3);
    if (local_24 < pMVar4->tick) {
      pMVar3 = operator[](this,local_28);
      pMVar4 = MidiEventList::back(pMVar3);
      local_24 = pMVar4->tick;
    }
  }
  if (bVar1) {
    deltaTicks(this);
  }
  return local_24;
}

Assistant:

int MidiFile::getFileDurationInTicks(void) {
	bool revertToDelta = false;
	if (isDeltaTicks()) {
		makeAbsoluteTicks();
		revertToDelta = true;
	}
	const MidiFile& mf = *this;
	int output = 0;
	for (int i=0; i<mf.getTrackCount(); i++) {
		if (mf[i].back().tick > output) {
			output = mf[i].back().tick;
		}
	}
	if (revertToDelta) {
		deltaTicks();
	}
	return output;
}